

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O3

void uv__udp_sendmsg(uv_udp_t *handle)

{
  void **ppvVar1;
  short sVar2;
  undefined8 *puVar3;
  int iVar4;
  uv__mmsghdr *puVar5;
  int *piVar6;
  long lVar7;
  long *plVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  undefined4 uVar12;
  uv__mmsghdr local_538 [20];
  
  uv_once(&once,uv__udp_mmsg_init);
  if (uv__sendmmsg_avail == '\0') {
    plVar8 = (long *)handle->write_queue[0];
    if (handle->write_queue == (void **)plVar8) {
      return;
    }
    do {
      if (plVar8 == (long *)0x0) {
        __assert_fail("q != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/ThirdParty/libuv/src/unix/udp.c"
                      ,0x1a8,"void uv__udp_sendmsg(uv_udp_t *)");
      }
      local_538[0].msg_hdr.msg_control = (void *)0x0;
      local_538[0].msg_hdr.msg_controllen = 0;
      local_538[0].msg_hdr.msg_iov = (iovec *)0x0;
      local_538[0].msg_hdr.msg_iovlen = 0;
      local_538[0].msg_hdr.msg_name = (long *)0x0;
      local_538[0].msg_hdr._8_8_ = 0;
      local_538[0].msg_hdr.msg_flags = 0;
      local_538[0].msg_hdr._52_4_ = 0;
      sVar2 = (short)plVar8[2];
      if (sVar2 != 0) {
        local_538[0].msg_hdr.msg_name = plVar8 + 2;
        if (sVar2 == 1) {
          uVar9 = 0x6e;
        }
        else {
          uVar9 = 0x1c;
          if (sVar2 != 10) {
            if (sVar2 != 2) {
              __assert_fail("0 && \"unsupported address family\"",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/ThirdParty/libuv/src/unix/udp.c"
                            ,0x1ba,"void uv__udp_sendmsg(uv_udp_t *)");
            }
            uVar9 = 0x10;
          }
        }
        local_538[0].msg_hdr._12_4_ = 0;
        local_538[0].msg_hdr.msg_namelen = uVar9;
      }
      local_538[0].msg_hdr.msg_iov = (iovec *)plVar8[0x13];
      local_538[0].msg_hdr.msg_iovlen = (size_t)*(uint *)(plVar8 + 0x12);
      do {
        lVar7 = sendmsg((handle->io_watcher).fd,(msghdr *)local_538,0);
        if (lVar7 != -1) goto LAB_00134b10;
        piVar6 = __errno_location();
        iVar4 = *piVar6;
      } while ((long)iVar4 == 4);
      if (iVar4 == 0xb) {
        return;
      }
      if (iVar4 == 0x69) {
        return;
      }
      lVar7 = -(long)iVar4;
LAB_00134b10:
      plVar8[0x14] = lVar7;
      lVar7 = *plVar8;
      *(long *)plVar8[1] = lVar7;
      *(long *)(lVar7 + 8) = plVar8[1];
      *plVar8 = (long)handle->write_completed_queue;
      puVar3 = (undefined8 *)handle->write_completed_queue[1];
      plVar8[1] = (long)puVar3;
      *puVar3 = plVar8;
      handle->write_completed_queue[1] = plVar8;
      uv__io_feed(handle->loop,&handle->io_watcher);
      plVar8 = (long *)handle->write_queue[0];
      if (handle->write_queue == (void **)plVar8) {
        return;
      }
    } while( true );
  }
  ppvVar1 = handle->write_queue;
  plVar8 = (long *)handle->write_queue[0];
  if (ppvVar1 == (void **)plVar8) {
    return;
  }
LAB_00134901:
  if ((void **)plVar8 == ppvVar1) {
    uVar10 = 0;
  }
  else {
    puVar5 = local_538;
    uVar11 = 0;
    do {
      if (plVar8 == (long *)0x0) {
        __assert_fail("q != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/ThirdParty/libuv/src/unix/udp.c"
                      ,0x14b,"void uv__udp_sendmmsg(uv_udp_t *)");
      }
      *(long *)((long)puVar5 + 0x30) = 0;
      *(long *)((long)puVar5 + 0x38) = 0;
      *(long *)((long)puVar5 + 0x20) = 0;
      *(long *)((long)puVar5 + 0x28) = 0;
      *(long *)((long)puVar5 + 0x10) = 0;
      *(long *)((long)puVar5 + 0x18) = 0;
      *(long *)puVar5 = 0;
      *(long *)((long)puVar5 + 8) = 0;
      sVar2 = (short)plVar8[2];
      if (sVar2 != 0) {
        *(long **)puVar5 = plVar8 + 2;
        if (sVar2 == 1) {
          uVar12 = 0x6e;
        }
        else {
          uVar12 = 0x1c;
          if (sVar2 != 10) {
            if (sVar2 != 2) {
              __assert_fail("0 && \"unsupported address family\"",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/ThirdParty/libuv/src/unix/udp.c"
                            ,0x15d,"void uv__udp_sendmmsg(uv_udp_t *)");
            }
            uVar12 = 0x10;
          }
        }
        *(undefined4 *)((long)puVar5 + 8) = uVar12;
      }
      *(long *)((long)puVar5 + 0x10) = plVar8[0x13];
      *(ulong *)((long)puVar5 + 0x18) = (ulong)*(uint *)(plVar8 + 0x12);
      uVar10 = uVar11 + 1;
      if (0x12 < uVar11) break;
      plVar8 = (long *)*plVar8;
      puVar5 = (uv__mmsghdr *)((long)puVar5 + 0x40);
      uVar11 = uVar10;
    } while ((void **)plVar8 != ppvVar1);
  }
  do {
    iVar4 = uv__sendmmsg((handle->io_watcher).fd,local_538,(uint)uVar10);
    if (iVar4 != -1) break;
    piVar6 = __errno_location();
    iVar4 = *piVar6;
    if (iVar4 != 4) goto LAB_00134b6b;
  } while( true );
  if (iVar4 < 1) {
    piVar6 = __errno_location();
    iVar4 = *piVar6;
LAB_00134b6b:
    if (iVar4 == 0xb) {
      return;
    }
    if (iVar4 == 0x69) {
      return;
    }
    plVar8 = (long *)*ppvVar1;
    if ((void **)plVar8 != ppvVar1 && uVar10 != 0) {
      uVar11 = 1;
      goto LAB_00134ba1;
    }
    goto LAB_00134bef;
  }
  plVar8 = (long *)*ppvVar1;
  if ((void **)plVar8 == ppvVar1) goto LAB_00134bef;
  uVar10 = 1;
  do {
    if (plVar8 == (long *)0x0) {
      __assert_fail("q != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/ThirdParty/libuv/src/unix/udp.c"
                    ,0x181,"void uv__udp_sendmmsg(uv_udp_t *)");
    }
    plVar8[0x14] = *(long *)(plVar8[0x13] + 8);
    lVar7 = *plVar8;
    *(long *)plVar8[1] = lVar7;
    *(long *)(lVar7 + 8) = plVar8[1];
    *plVar8 = (long)handle->write_completed_queue;
    puVar3 = (undefined8 *)handle->write_completed_queue[1];
    plVar8[1] = (long)puVar3;
    *puVar3 = plVar8;
    handle->write_completed_queue[1] = plVar8;
    plVar8 = (long *)handle->write_queue[0];
  } while ((uVar10 < (ulong)(long)iVar4) && (uVar10 = uVar10 + 1, (void **)plVar8 != ppvVar1));
  if (ppvVar1 == (void **)plVar8) goto LAB_00134bef;
  goto LAB_00134901;
  while( true ) {
    plVar8 = (long *)handle->write_queue[0];
    uVar11 = uVar11 + 1;
    if ((void **)plVar8 == ppvVar1) break;
LAB_00134ba1:
    if (plVar8 == (long *)0x0) {
      __assert_fail("q != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/ThirdParty/libuv/src/unix/udp.c"
                    ,0x16f,"void uv__udp_sendmmsg(uv_udp_t *)");
    }
    plVar8[0x14] = (long)-iVar4;
    lVar7 = *plVar8;
    *(long *)plVar8[1] = lVar7;
    *(long *)(lVar7 + 8) = plVar8[1];
    *plVar8 = (long)handle->write_completed_queue;
    puVar3 = (undefined8 *)handle->write_completed_queue[1];
    plVar8[1] = (long)puVar3;
    *puVar3 = plVar8;
    handle->write_completed_queue[1] = plVar8;
    if (uVar10 <= uVar11) break;
  }
LAB_00134bef:
  uv__io_feed(handle->loop,&handle->io_watcher);
  return;
}

Assistant:

static void uv__udp_sendmsg(uv_udp_t* handle) {
  uv_udp_send_t* req;
  struct msghdr h;
  QUEUE* q;
  ssize_t size;

#if HAVE_MMSG
  uv_once(&once, uv__udp_mmsg_init);
  if (uv__sendmmsg_avail) {
    uv__udp_sendmmsg(handle);
    return;
  }
#endif

  while (!QUEUE_EMPTY(&handle->write_queue)) {
    q = QUEUE_HEAD(&handle->write_queue);
    assert(q != NULL);

    req = QUEUE_DATA(q, uv_udp_send_t, queue);
    assert(req != NULL);

    memset(&h, 0, sizeof h);
    if (req->addr.ss_family == AF_UNSPEC) {
      h.msg_name = NULL;
      h.msg_namelen = 0;
    } else {
      h.msg_name = &req->addr;
      if (req->addr.ss_family == AF_INET6)
        h.msg_namelen = sizeof(struct sockaddr_in6);
      else if (req->addr.ss_family == AF_INET)
        h.msg_namelen = sizeof(struct sockaddr_in);
      else if (req->addr.ss_family == AF_UNIX)
        h.msg_namelen = sizeof(struct sockaddr_un);
      else {
        assert(0 && "unsupported address family");
        abort();
      }
    }
    h.msg_iov = (struct iovec*) req->bufs;
    h.msg_iovlen = req->nbufs;

    do {
      size = sendmsg(handle->io_watcher.fd, &h, 0);
    } while (size == -1 && errno == EINTR);

    if (size == -1) {
      if (errno == EAGAIN || errno == EWOULDBLOCK || errno == ENOBUFS)
        break;
    }

    req->status = (size == -1 ? UV__ERR(errno) : size);

    /* Sending a datagram is an atomic operation: either all data
     * is written or nothing is (and EMSGSIZE is raised). That is
     * why we don't handle partial writes. Just pop the request
     * off the write queue and onto the completed queue, done.
     */
    QUEUE_REMOVE(&req->queue);
    QUEUE_INSERT_TAIL(&handle->write_completed_queue, &req->queue);
    uv__io_feed(handle->loop, &handle->io_watcher);
  }
}